

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int vcf_parse(kstring_t *s,bcf_hdr_t *h,bcf1_t *v)

{
  char cVar1;
  int32_t x;
  kh_vdict_t *pkVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  kstring_t *s_00;
  bcf_hrec_t *pbVar9;
  float *a_00;
  long lVar10;
  float *pfVar11;
  double dVar12;
  undefined1 auStack_1b8 [5];
  bool local_1b3;
  bool local_1b2;
  bool local_1b1;
  float *local_1b0;
  float *z_1;
  int32_t *z;
  char *te;
  char *t_1;
  int local_188;
  int n_val;
  int i_2;
  uint32_t y;
  bcf_hrec_t *hrec_2;
  undefined1 local_170 [4];
  int l_2;
  kstring_t tmp_2;
  char *end;
  char *val;
  int c;
  vdict_t *d_2;
  char *key;
  bcf_hrec_t *hrec_1;
  undefined1 local_120 [4];
  int l_1;
  kstring_t tmp_1;
  vdict_t *d_1;
  ks_tokaux_t aux1;
  int i_1;
  int n_flt;
  int32_t *a;
  bcf_hrec_t *hrec;
  undefined1 local_b0 [4];
  int l;
  kstring_t tmp;
  vdict_t *d;
  ks_tokaux_t aux;
  khint_t k;
  kstring_t *str;
  char *t;
  char *r;
  char *q;
  char *p;
  int i;
  bcf1_t *v_local;
  bcf_hdr_t *h_local;
  kstring_t *s_local;
  
  a_00 = (float *)auStack_1b8;
  bcf_clear(v);
  s_00 = &v->shared;
  memset(&d,0,0x30);
  q = kstrtok(s->s,"\t",(ks_tokaux_t *)&d);
  p._4_4_ = 0;
  do {
    uVar6 = aux._32_8_;
    if (q == (char *)0x0) {
      return 0;
    }
    *(undefined1 *)aux._32_8_ = 0;
    if (p._4_4_ == 0) {
      pkVar2 = (kh_vdict_t *)h->dict[1];
      tmp.s = (char *)pkVar2;
      *(undefined8 *)((long)a_00 + -8) = 0x11e5ff;
      aux.p._4_4_ = kh_get_vdict(pkVar2,q);
      if (aux.p._4_4_ == *(khint_t *)tmp.s) {
        *(undefined8 *)((long)a_00 + -8) = 0x11e637;
        fprintf(_stderr,
                "[W::%s] contig \'%s\' is not defined in the header. (Quick workaround: index the file with tabix.)\n"
                ,"vcf_parse",q);
        *(undefined8 *)((long)a_00 + -8) = 0x11e64a;
        memset(local_b0,0,0x18);
        *(undefined8 *)((long)a_00 + -8) = 0x11e663;
        ksprintf((kstring_t *)local_b0,"##contig=<ID=%s>",q);
        sVar5 = tmp.m;
        *(undefined8 *)((long)a_00 + -8) = 0x11e67a;
        pbVar9 = bcf_hdr_parse_line(h,(char *)sVar5,(int *)((long)&hrec + 4));
        sVar5 = tmp.m;
        *(undefined8 *)((long)a_00 + -8) = 0x11e68d;
        free((void *)sVar5);
        *(undefined8 *)((long)a_00 + -8) = 0x11e69d;
        iVar7 = bcf_hdr_add_hrec(h,pbVar9);
        if (iVar7 != 0) {
          *(undefined8 *)((long)a_00 + -8) = 0x11e6ab;
          bcf_hdr_sync(h);
        }
        pcVar4 = tmp.s;
        *(undefined8 *)((long)a_00 + -8) = 0x11e6bb;
        aux.p._4_4_ = kh_get_vdict((kh_vdict_t *)pcVar4,q);
        v->errcode = 1;
      }
      v->rid = *(int32_t *)(*(long *)(tmp.s + 0x20) + (ulong)aux.p._4_4_ * 0x30 + 0x28);
    }
    else if (p._4_4_ == 1) {
      *(undefined8 *)((long)a_00 + -8) = 0x11e6fe;
      iVar7 = atoi(q);
      v->pos = iVar7 - 1;
    }
    else {
      iVar7 = aux.sep;
      iVar3 = (int)q;
      if (p._4_4_ == 2) {
        *(undefined8 *)((long)a_00 + -8) = 0x11e725;
        iVar8 = strcmp(q,".");
        if (iVar8 == 0) {
          *(undefined8 *)((long)a_00 + -8) = 0x11e756;
          bcf_enc_size(s_00,0,7);
        }
        else {
          *(undefined8 *)((long)a_00 + -8) = 0x11e744;
          bcf_enc_vchar(s_00,iVar7 - iVar3,q);
        }
      }
      else if (p._4_4_ == 3) {
        *(undefined8 *)((long)a_00 + -8) = 0x11e77b;
        bcf_enc_vchar(s_00,iVar7 - iVar3,q);
        *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffff0000ffff | 0x10000;
        v->rlen = iVar7 - iVar3;
      }
      else if (p._4_4_ == 4) {
        *(undefined8 *)((long)a_00 + -8) = 0x11e7cb;
        iVar7 = strcmp(q,".");
        if (iVar7 != 0) {
          str = (kstring_t *)q;
          t = q;
          while( true ) {
            if ((*t == ',') || (*t == '\0')) {
              *(undefined8 *)((long)a_00 + -8) = 0x11e812;
              bcf_enc_vchar(s_00,(int)t - (int)str,(char *)str);
              str = (kstring_t *)(t + 1);
              *(ulong *)&v->field_0x10 =
                   *(ulong *)&v->field_0x10 & 0xffffffff0000ffff |
                   ((ulong)(((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x10) & 0xffff) + 1) &
                   0xffff) << 0x10;
            }
            if (t == (char *)uVar6) break;
            t = t + 1;
          }
        }
      }
      else if (p._4_4_ == 5) {
        *(undefined8 *)((long)a_00 + -8) = 0x11e897;
        iVar7 = strcmp(q,".");
        if (iVar7 == 0) {
          v->qual = (float)bcf_float_missing;
        }
        else {
          *(undefined8 *)((long)a_00 + -8) = 0x11e8a5;
          dVar12 = atof(q);
          v->qual = (float)dVar12;
        }
        if ((v->max_unpack != 0) && (v->max_unpack >> 1 == 0)) {
          return 0;
        }
      }
      else if (p._4_4_ == 6) {
        *(undefined8 *)((long)a_00 + -8) = 0x11e90a;
        iVar7 = strcmp(q,".");
        if (iVar7 == 0) {
          *(undefined8 *)((long)a_00 + -8) = 0x11eb46;
          bcf_enc_vint(s_00,0,(int32_t *)0x0,-1);
        }
        else {
          aux1.p._4_4_ = 1;
          tmp_1.s = (char *)h->dict[0];
          if (*(char *)(uVar6 + -1) == ';') {
            *(undefined1 *)(uVar6 + -1) = 0;
          }
          for (t = q; *t != '\0'; t = t + 1) {
            if (*t == ';') {
              aux1.p._4_4_ = aux1.p._4_4_ + 1;
            }
          }
          a_00 = (float *)((long)a_00 + -((long)aux1.p._4_4_ * 4 + 0xfU & 0xfffffffffffffff0));
          ((int32_t *)a_00)[-2] = 0x11e9b7;
          ((int32_t *)a_00)[-1] = 0;
          str = (kstring_t *)kstrtok(q,";",(ks_tokaux_t *)&d_1);
          aux1.p._0_4_ = 0;
          while (iVar7 = (int)aux1.p, pcVar4 = tmp_1.s, str != (kstring_t *)0x0) {
            *(undefined1 *)aux1._32_8_ = 0;
            ((int32_t *)a_00)[-2] = 0x11e9ea;
            ((int32_t *)a_00)[-1] = 0;
            aux.p._4_4_ = kh_get_vdict((kh_vdict_t *)pcVar4,(kh_cstr_t)str);
            if (aux.p._4_4_ == *(khint_t *)tmp_1.s) {
              ((int32_t *)a_00)[-2] = 0x11ea22;
              ((int32_t *)a_00)[-1] = 0;
              fprintf(_stderr,"[W::%s] FILTER \'%s\' is not defined in the header\n","vcf_parse",str
                     );
              ((int32_t *)a_00)[-2] = 0x11ea35;
              ((int32_t *)a_00)[-1] = 0;
              memset(local_120,0,0x18);
              ((int32_t *)a_00)[-2] = 0x11ea4e;
              ((int32_t *)a_00)[-1] = 0;
              ksprintf((kstring_t *)local_120,"##FILTER=<ID=%s,Description=\"Dummy\">",str);
              sVar5 = tmp_1.m;
              ((int32_t *)a_00)[-2] = 0x11ea65;
              ((int32_t *)a_00)[-1] = 0;
              pbVar9 = bcf_hdr_parse_line(h,(char *)sVar5,(int *)((long)&hrec_1 + 4));
              sVar5 = tmp_1.m;
              ((int32_t *)a_00)[-2] = 0x11ea78;
              ((int32_t *)a_00)[-1] = 0;
              free((void *)sVar5);
              ((int32_t *)a_00)[-2] = 0x11ea88;
              ((int32_t *)a_00)[-1] = 0;
              iVar7 = bcf_hdr_add_hrec(h,pbVar9);
              if (iVar7 != 0) {
                ((int32_t *)a_00)[-2] = 0x11ea96;
                ((int32_t *)a_00)[-1] = 0;
                bcf_hdr_sync(h);
              }
              pcVar4 = tmp_1.s;
              ((int32_t *)a_00)[-2] = 0x11eaa6;
              ((int32_t *)a_00)[-1] = 0;
              aux.p._4_4_ = kh_get_vdict((kh_vdict_t *)pcVar4,(kh_cstr_t)str);
              v->errcode = 2;
            }
            ((int32_t *)a_00)[(int)aux1.p] =
                 *(int32_t *)(*(long *)(tmp_1.s + 0x20) + (ulong)aux.p._4_4_ * 0x30 + 0x28);
            aux1.p._0_4_ = (int)aux1.p + 1;
            ((int32_t *)a_00)[-2] = 0x11eb00;
            ((int32_t *)a_00)[-1] = 0;
            str = (kstring_t *)kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)&d_1);
          }
          aux1.p._4_4_ = (int)aux1.p;
          ((int32_t *)a_00)[-2] = 0x11eb30;
          ((int32_t *)a_00)[-1] = 0;
          bcf_enc_vint(s_00,iVar7,(int32_t *)a_00,-1);
        }
        if ((v->max_unpack != 0) && (v->max_unpack >> 2 == 0)) {
          return 0;
        }
      }
      else if (p._4_4_ == 7) {
        pkVar2 = (kh_vdict_t *)h->dict[0];
        *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffffff0000;
        *(undefined8 *)((long)a_00 + -8) = 0x11ebb6;
        iVar7 = strcmp(q,".");
        if (iVar7 != 0) {
          if (*(char *)(uVar6 + -1) == ';') {
            *(undefined1 *)(uVar6 + -1) = 0;
          }
          d_2 = (vdict_t *)q;
          t = q;
          do {
            if (((*t == ';') || (*t == '=')) || (*t == '\0')) {
              end = (char *)0x0;
              cVar1 = *t;
              *t = '\0';
              if (cVar1 == '=') {
                end = t + 1;
                tmp_2.s = end;
                while( true ) {
                  local_1b1 = false;
                  if (*tmp_2.s != ';') {
                    local_1b1 = *tmp_2.s != '\0';
                  }
                  if (local_1b1 == false) break;
                  tmp_2.s = tmp_2.s + 1;
                }
                cVar1 = *tmp_2.s;
                *tmp_2.s = '\0';
              }
              else {
                tmp_2.s = t;
              }
              if ((char)d_2->n_buckets == '\0') {
                if (cVar1 == '\0') break;
                t = tmp_2.s;
                d_2 = (vdict_t *)(tmp_2.s + 1);
              }
              else {
                *(undefined8 *)((long)a_00 + -8) = 0x11ed22;
                aux.p._4_4_ = kh_get_vdict(pkVar2,(kh_cstr_t)d_2);
                if ((aux.p._4_4_ == pkVar2->n_buckets) || (pkVar2->vals[aux.p._4_4_].info[1] == 0xf)
                   ) {
                  *(undefined8 *)((long)a_00 + -8) = 0x11ed78;
                  fprintf(_stderr,
                          "[W::%s] INFO \'%s\' is not defined in the header, assuming Type=String\n"
                          ,"vcf_parse",d_2);
                  *(undefined8 *)((long)a_00 + -8) = 0x11ed8b;
                  memset(local_170,0,0x18);
                  *(undefined8 *)((long)a_00 + -8) = 0x11eda7;
                  ksprintf((kstring_t *)local_170,
                           "##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">",d_2);
                  sVar5 = tmp_2.m;
                  *(undefined8 *)((long)a_00 + -8) = 0x11edbe;
                  _i_2 = bcf_hdr_parse_line(h,(char *)sVar5,(int *)((long)&hrec_2 + 4));
                  sVar5 = tmp_2.m;
                  *(undefined8 *)((long)a_00 + -8) = 0x11edd1;
                  free((void *)sVar5);
                  pbVar9 = _i_2;
                  *(undefined8 *)((long)a_00 + -8) = 0x11ede1;
                  iVar7 = bcf_hdr_add_hrec(h,pbVar9);
                  if (iVar7 != 0) {
                    *(undefined8 *)((long)a_00 + -8) = 0x11edef;
                    bcf_hdr_sync(h);
                  }
                  *(undefined8 *)((long)a_00 + -8) = 0x11ee02;
                  aux.p._4_4_ = kh_get_vdict(pkVar2,(kh_cstr_t)d_2);
                  v->errcode = 2;
                }
                n_val = pkVar2->vals[aux.p._4_4_].info[1];
                *(ulong *)&v->field_0x10 =
                     *(ulong *)&v->field_0x10 & 0xffffffffffff0000 |
                     (ulong)(((uint)*(undefined8 *)&v->field_0x10 & 0xffff) + 1) & 0xffff;
                x = pkVar2->vals[aux.p._4_4_].id;
                *(undefined8 *)((long)a_00 + -8) = 0x11ee81;
                bcf_enc_int1(s_00,x);
                if (end == (char *)0x0) {
                  *(undefined8 *)((long)a_00 + -8) = 0x11ee98;
                  bcf_enc_size(s_00,0,0);
                }
                else if ((((uint)n_val >> 4 & 0xf) == 0) || (((uint)n_val >> 4 & 0xf) == 3)) {
                  iVar7 = (int)tmp_2.s;
                  *(undefined8 *)((long)a_00 + -8) = 0x11eee2;
                  bcf_enc_vchar(s_00,iVar7 - (int)end,end);
                }
                else {
                  t_1._4_4_ = 1;
                  for (te = end; *te != '\0'; te = te + 1) {
                    if (*te == ',') {
                      t_1._4_4_ = t_1._4_4_ + 1;
                    }
                  }
                  if (((uint)n_val >> 4 & 0xf) == 1) {
                    a_00 = (float *)((long)a_00 + -((long)t_1._4_4_ * 4 + 0xfU & 0xfffffffffffffff0)
                                    );
                    te = end;
                    z_1 = a_00;
                    for (local_188 = 0; iVar7 = t_1._4_4_, pcVar4 = te, pfVar11 = z_1,
                        local_188 < t_1._4_4_; local_188 = local_188 + 1) {
                      a_00[-2] = 1.6472e-39;
                      a_00[-1] = 0.0;
                      lVar10 = strtol(pcVar4,(char **)&z,10);
                      z_1[local_188] = (float)lVar10;
                      if (z == (int32_t *)te) {
                        z_1[local_188] = -0.0;
                        while( true ) {
                          local_1b2 = false;
                          if ((char)*z != '\0') {
                            local_1b2 = (char)*z != ',';
                          }
                          if (local_1b2 == false) break;
                          z = (int32_t *)((long)z + 1);
                        }
                      }
                      te = (char *)((long)z + 1);
                    }
                    a_00[-2] = 1.6475e-39;
                    a_00[-1] = 0.0;
                    bcf_enc_vint(s_00,iVar7,(int32_t *)pfVar11,-1);
                    a_00[-2] = 1.647526e-39;
                    a_00[-1] = 0.0;
                    iVar7 = strcmp((char *)d_2,"END");
                    if (iVar7 == 0) {
                      v->rlen = (int)*z_1 - v->pos;
                    }
                  }
                  else if (((uint)n_val >> 4 & 0xf) == 2) {
                    a_00 = (float *)((long)a_00 + -((long)t_1._4_4_ * 4 + 0xfU & 0xfffffffffffffff0)
                                    );
                    te = end;
                    local_1b0 = a_00;
                    for (local_188 = 0; iVar7 = t_1._4_4_, pcVar4 = te, pfVar11 = local_1b0,
                        local_188 < t_1._4_4_; local_188 = local_188 + 1) {
                      a_00[-2] = 1.647736e-39;
                      a_00[-1] = 0.0;
                      dVar12 = strtod(pcVar4,(char **)&z);
                      local_1b0[local_188] = (float)dVar12;
                      if (z == (int32_t *)te) {
                        pfVar11 = local_1b0 + local_188;
                        a_00[-2] = 1.647836e-39;
                        a_00[-1] = 0.0;
                        bcf_float_set(pfVar11,bcf_float_missing);
                        while( true ) {
                          local_1b3 = false;
                          if ((char)*z != '\0') {
                            local_1b3 = (char)*z != ',';
                          }
                          if (local_1b3 == false) break;
                          z = (int32_t *)((long)z + 1);
                        }
                      }
                      te = (char *)((long)z + 1);
                    }
                    a_00[-2] = 1.64805e-39;
                    a_00[-1] = 0.0;
                    bcf_enc_vfloat(s_00,iVar7,pfVar11);
                  }
                }
                if (cVar1 == '\0') break;
                t = tmp_2.s;
                d_2 = (vdict_t *)(tmp_2.s + 1);
              }
            }
            t = t + 1;
          } while( true );
        }
        if ((v->max_unpack != 0) && (v->max_unpack >> 3 == 0)) {
          return 0;
        }
      }
      else if (p._4_4_ == 8) {
        *(undefined8 *)((long)a_00 + -8) = 0x11f29f;
        iVar7 = _vcf_parse_format(s,h,v,q,(char *)aux._32_8_);
        return iVar7;
      }
    }
    *(undefined8 *)((long)a_00 + -8) = 0x11f2c9;
    q = kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)&d);
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

int vcf_parse(kstring_t *s, const bcf_hdr_t *h, bcf1_t *v)
{
    int i = 0;
    char *p, *q, *r, *t;
    kstring_t *str;
    khint_t k;
    ks_tokaux_t aux;

    bcf_clear1(v);
    str = &v->shared;
    memset(&aux, 0, sizeof(ks_tokaux_t));
    for (p = kstrtok(s->s, "\t", &aux), i = 0; p; p = kstrtok(0, 0, &aux), ++i) {
        q = (char*)aux.p;
        *q = 0;
        if (i == 0) { // CHROM
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_CTG];
            k = kh_get(vdict, d, p);
            if (k == kh_end(d))
            {
                // Simple error recovery for chromosomes not defined in the header. It will not help when VCF header has
                // been already printed, but will enable tools like vcfcheck to proceed.
                fprintf(stderr, "[W::%s] contig '%s' is not defined in the header. (Quick workaround: index the file with tabix.)\n", __func__, p);
                kstring_t tmp = {0,0,0};
                int l;
                ksprintf(&tmp, "##contig=<ID=%s>", p);
                bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                free(tmp.s);
                if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                k = kh_get(vdict, d, p);
                v->errcode = BCF_ERR_CTG_UNDEF;
            }
            v->rid = kh_val(d, k).id;
        } else if (i == 1) { // POS
            v->pos = atoi(p) - 1;
        } else if (i == 2) { // ID
            if (strcmp(p, ".")) bcf_enc_vchar(str, q - p, p);
            else bcf_enc_size(str, 0, BCF_BT_CHAR);
        } else if (i == 3) { // REF
            bcf_enc_vchar(str, q - p, p);
            v->n_allele = 1, v->rlen = q - p;
        } else if (i == 4) { // ALT
            if (strcmp(p, ".")) {
                for (r = t = p;; ++r) {
                    if (*r == ',' || *r == 0) {
                        bcf_enc_vchar(str, r - t, t);
                        t = r + 1;
                        ++v->n_allele;
                    }
                    if (r == q) break;
                }
            }
        } else if (i == 5) { // QUAL
            if (strcmp(p, ".")) v->qual = atof(p);
            else memcpy(&v->qual, &bcf_float_missing, 4);
            if ( v->max_unpack && !(v->max_unpack>>1) ) return 0; // BCF_UN_STR
        } else if (i == 6) { // FILTER
            if (strcmp(p, ".")) {
                int32_t *a;
                int n_flt = 1, i;
                ks_tokaux_t aux1;
                vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
                // count the number of filters
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = p; *r; ++r)
                    if (*r == ';') ++n_flt;
                a = (int32_t*)alloca(n_flt * sizeof(int32_t));
                // add filters
                for (t = kstrtok(p, ";", &aux1), i = 0; t; t = kstrtok(0, 0, &aux1)) {
                    *(char*)aux1.p = 0;
                    k = kh_get(vdict, d, t);
                    if (k == kh_end(d))
                    {
                        // Simple error recovery for FILTERs not defined in the header. It will not help when VCF header has
                        // been already printed, but will enable tools like vcfcheck to proceed.
                        fprintf(stderr, "[W::%s] FILTER '%s' is not defined in the header\n", __func__, t);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##FILTER=<ID=%s,Description=\"Dummy\">", t);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, t);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    a[i++] = kh_val(d, k).id;
                }
                n_flt = i;
                bcf_enc_vint(str, n_flt, a, -1);
            } else bcf_enc_vint(str, 0, 0, -1);
            if ( v->max_unpack && !(v->max_unpack>>2) ) return 0;    // BCF_UN_FLT
        } else if (i == 7) { // INFO
            char *key;
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
            v->n_info = 0;
            if (strcmp(p, ".")) {
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = key = p;; ++r) {
                    int c;
                    char *val, *end;
                    if (*r != ';' && *r != '=' && *r != 0) continue;
                    val = end = 0;
                    c = *r; *r = 0;
                    if (c == '=') {
                        val = r + 1;
                        for (end = val; *end != ';' && *end != 0; ++end);
                        c = *end; *end = 0;
                    } else end = r;
                    if ( !*key ) { if (c==0) break; r = end; key = r + 1; continue; }  // faulty VCF, ";;" in the INFO
                    k = kh_get(vdict, d, key);
                    if (k == kh_end(d) || kh_val(d, k).info[BCF_HL_INFO] == 15)
                    {
                        fprintf(stderr, "[W::%s] INFO '%s' is not defined in the header, assuming Type=String\n", __func__, key);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">", key);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, key);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    uint32_t y = kh_val(d, k).info[BCF_HL_INFO];
                    ++v->n_info;
                    bcf_enc_int1(str, kh_val(d, k).id);
                    if (val == 0) {
                        bcf_enc_size(str, 0, BCF_BT_NULL);
                    } else if ((y>>4&0xf) == BCF_HT_FLAG || (y>>4&0xf) == BCF_HT_STR) { // if Flag has a value, treat it as a string
                        bcf_enc_vchar(str, end - val, val);
                    } else { // int/float value/array
                        int i, n_val;
                        char *t, *te;
                        for (t = val, n_val = 1; *t; ++t) // count the number of values
                            if (*t == ',') ++n_val;
                        if ((y>>4&0xf) == BCF_HT_INT) {
                            int32_t *z;
                            z = (int32_t*)alloca(n_val * sizeof(int32_t));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtol(t, &te, 10);
                                if ( te==t ) // conversion failed
                                {
                                    z[i] = bcf_int32_missing;
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vint(str, n_val, z, -1);
                            if (strcmp(key, "END") == 0) v->rlen = z[0] - v->pos;
                        } else if ((y>>4&0xf) == BCF_HT_REAL) {
                            float *z;
                            z = (float*)alloca(n_val * sizeof(float));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtod(t, &te);
                                if ( te==t ) // conversion failed
                                {
                                    bcf_float_set_missing(z[i]);
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vfloat(str, n_val, z);
                        }
                    }
                    if (c == 0) break;
                    r = end;
                    key = r + 1;
                }
            }
            if ( v->max_unpack && !(v->max_unpack>>3) ) return 0;
        } else if (i == 8) // FORMAT
            return _vcf_parse_format(s, h, v, p, q);
    }
    return 0;
}